

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

IDiagObjectAddress * __thiscall
Js::RecyclableObjectWalker::FindPropertyAddress
          (RecyclableObjectWalker *this,PropertyId propertyId,bool *isConst)

{
  Type pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppDVar6;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_00;
  Type *ppIVar7;
  undefined4 extraout_var;
  int iVar8;
  int i;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  if (this->pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
LAB_007ec487:
    this_00 = (RecyclableObjectAddress *)0x0;
    if (this->fakeGroupObjectWalkerList !=
        (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      iVar8 = 0;
      do {
        if ((this->fakeGroupObjectWalkerList->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count <= iVar8) {
          return (IDiagObjectAddress *)0x0;
        }
        ppIVar7 = JsUtil::
                  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->fakeGroupObjectWalkerList,iVar8);
        iVar4 = (*(*ppIVar7)->_vptr_IDiagObjectModelWalkerBase[3])(*ppIVar7,propertyId,isConst);
        this_00 = (RecyclableObjectAddress *)CONCAT44(extraout_var,iVar4);
        iVar8 = iVar8 + 1;
      } while (this_00 == (RecyclableObjectAddress *)0x0);
    }
  }
  else {
    iVar8 = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      if ((this->pMembersList->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count <= iVar8) goto LAB_007ec487;
      ppDVar6 = JsUtil::
                List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this->pMembersList,iVar8);
      pDVar1 = *ppDVar6;
      if (pDVar1 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x93f,"(pair)","pair");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      iVar8 = iVar8 + 1;
    } while (pDVar1->propId != propertyId);
    *isConst = (bool)((byte)pDVar1->flags & 1);
    alloc = GetArenaFromContext(this->scriptContext);
    this_00 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
    RecyclableObjectAddress::RecyclableObjectAddress
              (this_00,this->instance,propertyId,pDVar1->aVar,pDVar1->flags >> 1 & 1);
  }
  return &this_00->super_IDiagObjectAddress;
}

Assistant:

IDiagObjectAddress *RecyclableObjectWalker::FindPropertyAddress(PropertyId propertyId, bool& isConst)
    {
        GetChildrenCount(); // Ensure to populate members

        if (pMembersList != nullptr)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propertyId)
                {
                    isConst = pair->IsConst();
                    return Anew(GetArenaFromContext(scriptContext),
                        RecyclableObjectAddress,
                        instance,
                        propertyId,
                        pair->aVar,
                        pair->IsInDeadZone() ? TRUE : FALSE);
                }
            }
        }

        // Following is for "with object" scope lookup. We may have members in [Methods] group or prototype chain that need to
        // be exposed to expression evaluation.
        if (fakeGroupObjectWalkerList != nullptr)
        {
            // WARNING: Following depends on [Methods] group being before [prototype] group. We need to check local [Methods] group
            // first for local properties before going to prototype chain.
            for (int i = 0; i < fakeGroupObjectWalkerList->Count(); i++)
            {
                IDiagObjectAddress* address = fakeGroupObjectWalkerList->Item(i)->FindPropertyAddress(propertyId, isConst);
                if (address != nullptr)
                {
                    return address;
                }
            }
        }

        return nullptr;
    }